

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtree.c
# Opt level: O3

MutableSubtree
ts_subtree_new_node(SubtreePool *pool,TSSymbol symbol,SubtreeArray *children,uint alias_sequence_id,
                   TSLanguage *language)

{
  MutableSubtree self;
  ushort uVar1;
  int iVar2;
  undefined6 in_register_00000032;
  ushort uVar3;
  
  iVar2 = (int)CONCAT62(in_register_00000032,symbol);
  if (iVar2 == 0xffff) {
    uVar3 = 3;
  }
  else if (iVar2 == 0xfffe) {
    uVar3 = 0;
  }
  else {
    uVar3 = (byte)language->symbol_metadata[symbol] & 3;
  }
  self.ptr = ts_subtree_pool_allocate(pool);
  uVar1 = 0x18;
  if (symbol < 0xfffe) {
    uVar1 = 0;
  }
  (self.ptr)->ref_count = 1;
  (self.ptr)->child_count = 0;
  (((Length *)((long)self + 0x10))->extent).row = 0;
  (((Length *)((long)self + 0x10))->extent).column = 0;
  *(uint32_t *)((long)self + 0x1c) = 0;
  *(uint32_t *)((long)self + 0x20) = 0;
  ((Length *)((long)self + 4))->bytes = 0;
  (((Length *)((long)self + 4))->extent).row = 0;
  *(undefined8 *)&((self.ptr)->padding).extent.column = 0;
  (self.ptr)->symbol = symbol;
  (self.ptr)->parse_state = 0;
  *(ushort *)&(self.ptr)->field_0x2c = uVar3 | uVar1;
  *(undefined2 *)((long)&(self.ptr)->field_17 + 0x1a) = 0;
  *(undefined4 *)((long)&((self.ptr)->field_17).field_0.repeat_depth + 2) = 0;
  *(undefined8 *)((long)&(self.ptr)->field_17 + 0xe) = 0;
  *(undefined8 *)&(self.ptr)->field_0x2e = 0;
  *(undefined8 *)((long)&((self.ptr)->field_17).field_0.children + 6) = 0;
  ((self.ptr)->field_17).field_0.alias_sequence_id = (uint16_t)alias_sequence_id;
  *(undefined2 *)((long)&(self.ptr)->field_17 + 0x26) = 0;
  *(undefined8 *)((long)&(self.ptr)->field_17 + 0x1e) = 0;
  ts_subtree_set_children(self,children->contents,children->size,language);
  return (MutableSubtree)self.data;
}

Assistant:

MutableSubtree ts_subtree_new_node(SubtreePool *pool, TSSymbol symbol,
                                   SubtreeArray *children, unsigned alias_sequence_id,
                                   const TSLanguage *language) {
  TSSymbolMetadata metadata = ts_language_symbol_metadata(language, symbol);
  bool fragile = symbol == ts_builtin_sym_error || symbol == ts_builtin_sym_error_repeat;
  SubtreeHeapData *data = ts_subtree_pool_allocate(pool);
  *data = (SubtreeHeapData) {
    .ref_count = 1,
    .symbol = symbol,
    .alias_sequence_id = alias_sequence_id,
    .visible = metadata.visible,
    .named = metadata.named,
    .has_changes = false,
    .fragile_left = fragile,
    .fragile_right = fragile,
    .is_keyword = false,
    .node_count = 0,
    .first_leaf = {.symbol = 0, .parse_state = 0},
  };
  MutableSubtree result = {.ptr = data};
  ts_subtree_set_children(result, children->contents, children->size, language);
  return result;
}